

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O2

void duckdb::StandardFixedSizeAppend::Append<double>
               (SegmentStatistics *stats,data_ptr_t target,idx_t target_offset,
               UnifiedVectorFormat *adata,idx_t offset,idx_t count)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  idx_t row_idx;
  ulong uVar3;
  data_ptr_t pdVar4;
  bool bVar5;
  undefined8 uVar6;
  
  pdVar1 = adata->data;
  if ((adata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pdVar4 = target + target_offset * 8;
    while (bVar5 = count != 0, count = count - 1, bVar5) {
      psVar2 = adata->sel->sel_vector;
      uVar3 = offset;
      if (psVar2 != (sel_t *)0x0) {
        uVar3 = (ulong)psVar2[offset];
      }
      NumericStats::Update<double>
                (&(stats->statistics).stats_union.numeric_data,*(double *)(pdVar1 + uVar3 * 8));
      *(undefined8 *)pdVar4 = *(undefined8 *)(pdVar1 + uVar3 * 8);
      pdVar4 = pdVar4 + 8;
      offset = offset + 1;
    }
  }
  else {
    pdVar4 = target + target_offset * 8;
    while (bVar5 = count != 0, count = count - 1, bVar5) {
      psVar2 = adata->sel->sel_vector;
      row_idx = offset;
      if (psVar2 != (sel_t *)0x0) {
        row_idx = (idx_t)psVar2[offset];
      }
      bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(adata->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
      uVar6 = 0x7ff8000000000000;
      if (bVar5) {
        NumericStats::Update<double>
                  (&(stats->statistics).stats_union.numeric_data,*(double *)(pdVar1 + row_idx * 8));
        uVar6 = *(undefined8 *)(pdVar1 + row_idx * 8);
      }
      *(undefined8 *)pdVar4 = uVar6;
      pdVar4 = pdVar4 + 8;
      offset = offset + 1;
    }
  }
  return;
}

Assistant:

static void Append(SegmentStatistics &stats, data_ptr_t target, idx_t target_offset, UnifiedVectorFormat &adata,
	                   idx_t offset, idx_t count) {
		auto sdata = UnifiedVectorFormat::GetData<T>(adata);
		auto tdata = reinterpret_cast<T *>(target);
		if (!adata.validity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto source_idx = adata.sel->get_index(offset + i);
				auto target_idx = target_offset + i;
				bool is_null = !adata.validity.RowIsValid(source_idx);
				if (!is_null) {
					stats.statistics.UpdateNumericStats<T>(sdata[source_idx]);
					tdata[target_idx] = sdata[source_idx];
				} else {
					// we insert a NullValue<T> in the null gap for debuggability
					// this value should never be used or read anywhere
					tdata[target_idx] = NullValue<T>();
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto source_idx = adata.sel->get_index(offset + i);
				auto target_idx = target_offset + i;
				stats.statistics.UpdateNumericStats<T>(sdata[source_idx]);
				tdata[target_idx] = sdata[source_idx];
			}
		}
	}